

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O3

CURLMcode curl_multi_wait(CURLM *multi_handle,curl_waitfd *extra_fds,uint extra_nfds,int timeout_ms,
                         int *ret)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  pollfd *ufds;
  ulong uVar4;
  ulong uVar5;
  ulong extraout_RDX;
  ulong uVar6;
  ulong extraout_RDX_00;
  SessionHandle *pSVar7;
  uint timeout_ms_00;
  ushort uVar8;
  Curl_multi *multi;
  int iVar9;
  bool bVar10;
  curl_socket_t sockbunch [5];
  long timeout_internal;
  uint local_58 [8];
  long local_38;
  
  uVar5 = (ulong)extra_nfds;
  if (multi_handle == (CURLM *)0x0) {
    return CURLM_BAD_HANDLE;
  }
  if (*multi_handle != 0xbab1e) {
    return CURLM_BAD_HANDLE;
  }
  multi_timeout((Curl_multi *)multi_handle,&local_38);
  timeout_ms_00 = timeout_ms;
  if (local_38 < timeout_ms) {
    timeout_ms_00 = (uint)local_38;
  }
  if (local_38 < 0) {
    timeout_ms_00 = timeout_ms;
  }
  pSVar7 = *(SessionHandle **)((long)multi_handle + 8);
  iVar9 = 0;
  if (pSVar7 != (SessionHandle *)0x0) {
    uVar6 = extraout_RDX;
    iVar9 = 0;
    do {
      uVar1 = multi_getsock(pSVar7,(curl_socket_t *)local_58,(int)uVar6);
      uVar4 = 0;
      do {
        if ((uVar1 >> ((uint)uVar4 & 0x1f) & 1) == 0) {
          uVar6 = 0xffffffff;
        }
        else {
          iVar9 = iVar9 + 1;
          uVar6 = (ulong)local_58[uVar4];
        }
        if (((uVar1 >> ((byte)uVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          iVar9 = iVar9 + 1;
          uVar6 = (ulong)local_58[uVar4];
        }
      } while (((int)uVar6 != -1) && (uVar6 = uVar4 + 1, bVar10 = uVar4 < 4, uVar4 = uVar6, bVar10))
      ;
      pSVar7 = pSVar7->next;
    } while (pSVar7 != (SessionHandle *)0x0);
  }
  uVar1 = 0;
  if (iVar9 + extra_nfds == 0 && extra_nfds == 0) {
    ufds = (pollfd *)0x0;
  }
  else {
    ufds = (pollfd *)(*Curl_cmalloc)((ulong)(iVar9 + extra_nfds) << 3);
    uVar5 = extraout_RDX_00;
    if (ufds == (pollfd *)0x0) {
      return CURLM_OUT_OF_MEMORY;
    }
  }
  if ((iVar9 != 0) &&
     (pSVar7 = *(SessionHandle **)((long)multi_handle + 8), pSVar7 != (SessionHandle *)0x0)) {
    uVar6 = 0;
    do {
      uVar2 = multi_getsock(pSVar7,(curl_socket_t *)local_58,(int)uVar5);
      uVar4 = 0;
      do {
        if ((uVar2 >> ((uint)uVar4 & 0x1f) & 1) == 0) {
          uVar5 = 0xffffffff;
        }
        else {
          uVar5 = (ulong)local_58[uVar4];
          ufds[uVar6].fd = local_58[uVar4];
          ufds[uVar6].events = 1;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        if (((uVar2 >> ((byte)uVar4 & 0x1f)) >> 0x10 & 1) != 0) {
          uVar5 = (ulong)local_58[uVar4];
          ufds[uVar6].fd = local_58[uVar4];
          ufds[uVar6].events = 4;
          uVar6 = (ulong)((int)uVar6 + 1);
        }
        uVar1 = (uint)uVar6;
      } while (((int)uVar5 != -1) && (uVar5 = uVar4 + 1, bVar10 = uVar4 < 4, uVar4 = uVar5, bVar10))
      ;
      pSVar7 = pSVar7->next;
    } while (pSVar7 != (SessionHandle *)0x0);
  }
  if (extra_nfds != 0) {
    uVar5 = 0;
    do {
      uVar2 = uVar1 + (int)uVar5;
      ufds[uVar2].fd = extra_fds[uVar5].fd;
      uVar8 = extra_fds[uVar5].events & 1;
      ufds[uVar2].events = uVar8;
      if ((extra_fds[uVar5].events & 6U) != 0) {
        ufds[uVar2].events = uVar8 | extra_fds[uVar5].events & 6U;
      }
      uVar5 = uVar5 + 1;
    } while (extra_nfds != uVar5);
    uVar1 = uVar1 + (int)uVar5;
  }
  if (uVar1 == 0) {
    iVar3 = 0;
LAB_0046f6c1:
    if (ufds == (pollfd *)0x0) goto LAB_0046f6d7;
  }
  else {
    Curl_infof((SessionHandle *)0x0,"Curl_poll(%d ds, %d ms)\n",(ulong)uVar1,(ulong)timeout_ms_00);
    iVar3 = Curl_poll(ufds,uVar1,timeout_ms_00);
    if (iVar3 == 0 || extra_nfds == 0) goto LAB_0046f6c1;
    uVar5 = 0;
    do {
      extra_fds[uVar5].revents = ufds[(uint)(iVar9 + (int)uVar5)].revents & 7;
      uVar5 = uVar5 + 1;
    } while (extra_nfds != uVar5);
  }
  (*Curl_cfree)(ufds);
LAB_0046f6d7:
  if (ret != (int *)0x0) {
    *ret = iVar3;
  }
  return CURLM_OK;
}

Assistant:

CURLMcode curl_multi_wait(CURLM *multi_handle,
                          struct curl_waitfd extra_fds[],
                          unsigned int extra_nfds,
                          int timeout_ms,
                          int *ret)
{
  struct Curl_multi *multi=(struct Curl_multi *)multi_handle;
  struct SessionHandle *data;
  curl_socket_t sockbunch[MAX_SOCKSPEREASYHANDLE];
  int bitmap;
  unsigned int i;
  unsigned int nfds = 0;
  unsigned int curlfds;
  struct pollfd *ufds = NULL;
  long timeout_internal;

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  /* If the internally desired timeout is actually shorter than requested from
     the outside, then use the shorter time! But only if the internal timer
     is actually larger than -1! */
  (void)multi_timeout(multi, &timeout_internal);
  if((timeout_internal >= 0) && (timeout_internal < (long)timeout_ms))
    timeout_ms = (int)timeout_internal;

  /* Count up how many fds we have from the multi handle */
  data=multi->easyp;
  while(data) {
    bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

    for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
      curl_socket_t s = CURL_SOCKET_BAD;

      if(bitmap & GETSOCK_READSOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(bitmap & GETSOCK_WRITESOCK(i)) {
        ++nfds;
        s = sockbunch[i];
      }
      if(s == CURL_SOCKET_BAD) {
        break;
      }
    }

    data = data->next; /* check next handle */
  }

  curlfds = nfds; /* number of internal file descriptors */
  nfds += extra_nfds; /* add the externally provided ones */

  if(nfds || extra_nfds) {
    ufds = malloc(nfds * sizeof(struct pollfd));
    if(!ufds)
      return CURLM_OUT_OF_MEMORY;
  }
  nfds = 0;

  /* only do the second loop if we found descriptors in the first stage run
     above */

  if(curlfds) {
    /* Add the curl handles to our pollfds first */
    data=multi->easyp;
    while(data) {
      bitmap = multi_getsock(data, sockbunch, MAX_SOCKSPEREASYHANDLE);

      for(i=0; i< MAX_SOCKSPEREASYHANDLE; i++) {
        curl_socket_t s = CURL_SOCKET_BAD;

        if(bitmap & GETSOCK_READSOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLIN;
          ++nfds;
          s = sockbunch[i];
        }
        if(bitmap & GETSOCK_WRITESOCK(i)) {
          ufds[nfds].fd = sockbunch[i];
          ufds[nfds].events = POLLOUT;
          ++nfds;
          s = sockbunch[i];
        }
        if(s == CURL_SOCKET_BAD) {
          break;
        }
      }

      data = data->next; /* check next handle */
    }
  }

  /* Add external file descriptions from poll-like struct curl_waitfd */
  for(i = 0; i < extra_nfds; i++) {
    ufds[nfds].fd = extra_fds[i].fd;
    ufds[nfds].events = 0;
    if(extra_fds[i].events & CURL_WAIT_POLLIN)
      ufds[nfds].events |= POLLIN;
    if(extra_fds[i].events & CURL_WAIT_POLLPRI)
      ufds[nfds].events |= POLLPRI;
    if(extra_fds[i].events & CURL_WAIT_POLLOUT)
      ufds[nfds].events |= POLLOUT;
    ++nfds;
  }

  if(nfds) {
    /* wait... */
    infof(data, "Curl_poll(%d ds, %d ms)\n", nfds, timeout_ms);
    i = Curl_poll(ufds, nfds, timeout_ms);

    if(i) {
      unsigned int j;
      /* copy revents results from the poll to the curl_multi_wait poll
         struct, the bit values of the actual underlying poll() implementation
         may not be the same as the ones in the public libcurl API! */
      for(j = 0; j < extra_nfds; j++) {
        unsigned short mask = 0;
        unsigned r = ufds[curlfds + j].revents;

        if(r & POLLIN)
          mask |= CURL_WAIT_POLLIN;
        if(r & POLLOUT)
          mask |= CURL_WAIT_POLLOUT;
        if(r & POLLPRI)
          mask |= CURL_WAIT_POLLPRI;

        extra_fds[j].revents = mask;
      }
    }
  }
  else
    i = 0;

  Curl_safefree(ufds);
  if(ret)
    *ret = i;
  return CURLM_OK;
}